

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O0

bool __thiscall
ON_Brep::IsValidFaceTolerancesAndFlags(ON_Brep *this,int face_index,ON_TextLog *text_log)

{
  int iVar1;
  uint uVar2;
  ON_BrepFace *pOVar3;
  ON_BrepFace *face;
  ON_TextLog *text_log_local;
  int face_index_local;
  ON_Brep *this_local;
  
  if ((-1 < face_index) &&
     (iVar1 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F),
     face_index < iVar1)) {
    pOVar3 = ON_ClassArray<ON_BrepFace>::operator[]
                       ((ON_ClassArray<ON_BrepFace> *)&this->m_F,face_index);
    if (pOVar3->m_face_index != face_index) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",(ulong)(uint)face_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"face.m_face_index = %d (should be %d).\n",
                          (ulong)(uint)pOVar3->m_face_index,(ulong)(uint)face_index);
        ON_TextLog::PopIndent(text_log);
      }
      return false;
    }
    return true;
  }
  if (text_log != (ON_TextLog *)0x0) {
    uVar2 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
    ON_TextLog::Print(text_log,"brep face_index = %d (should be >=0 and <%d=brep.m_F.Count() ).\n",
                      (ulong)(uint)face_index,(ulong)uVar2);
  }
  return false;
}

Assistant:

bool
ON_Brep::IsValidFaceTolerancesAndFlags( int face_index, ON_TextLog* text_log ) const
{
  if ( face_index < 0 || face_index >= m_F.Count() )
  {
    if ( text_log )
      text_log->Print("brep face_index = %d (should be >=0 and <%d=brep.m_F.Count() ).\n",
                      face_index, m_F.Count());
    return false;
  }
  const ON_BrepFace& face = m_F[face_index];
  if ( face.m_face_index != face_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_face_index = %d (should be %d).\n",
                       face.m_face_index, face_index );
      text_log->PopIndent();
    }
    return false;
  }
  return true;
}